

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cuddLCache.c
# Opt level: O0

DdHashItem * cuddHashTableAlloc(DdHashTable *hash)

{
  uint uVar1;
  DdSubtable *pDVar2;
  _func_void_long *p_Var3;
  DdHashItem *pDVar4;
  DdHashItem *item;
  DdHashItem *next;
  DdHashItem *thisOne;
  DdHashItem **mem;
  DD_OOMFP saveHandler;
  uint itemsize;
  int i;
  DdHashTable *hash_local;
  
  p_Var3 = Extra_UtilMMoutOfMemory;
  uVar1 = hash->itemsize;
  if (hash->nextFree == (DdHashItem *)0x0) {
    Extra_UtilMMoutOfMemory = Cudd_OutOfMem;
    thisOne = (DdHashItem *)malloc((ulong)(uVar1 * 0x3ff));
    Extra_UtilMMoutOfMemory = p_Var3;
    if (thisOne == (DdHashItem *)0x0) {
      if (hash->manager->stash != (char *)0x0) {
        if (hash->manager->stash != (char *)0x0) {
          free(hash->manager->stash);
          hash->manager->stash = (char *)0x0;
        }
        hash->manager->stash = (char *)0x0;
        hash->manager->maxCacheHard = hash->manager->cacheSlots - 1;
        hash->manager->cacheSlack = -(hash->manager->cacheSlots + 1);
        for (saveHandler._4_4_ = 0; saveHandler._4_4_ < hash->manager->size;
            saveHandler._4_4_ = saveHandler._4_4_ + 1) {
          pDVar2 = hash->manager->subtables;
          pDVar2[saveHandler._4_4_].maxKeys = pDVar2[saveHandler._4_4_].maxKeys << 2;
        }
        hash->manager->gcFrac = 0.2;
        hash->manager->minDead = (uint)(long)((double)hash->manager->slots * 0.2);
        thisOne = (DdHashItem *)malloc((ulong)(uVar1 * 0x3ff));
      }
      if (thisOne == (DdHashItem *)0x0) {
        (*Extra_UtilMMoutOfMemory)((long)uVar1 * 0x3ff);
        hash->manager->errorCode = CUDD_MEMORY_OUT;
        return (DdHashItem *)0x0;
      }
    }
    thisOne->next = (DdHashItem *)hash->memoryList;
    hash->memoryList = &thisOne->next;
    next = (DdHashItem *)((long)thisOne->key + ((ulong)uVar1 - 0x18));
    hash->nextFree = next;
    for (saveHandler._4_4_ = 1; saveHandler._4_4_ < 0x3fe; saveHandler._4_4_ = saveHandler._4_4_ + 1
        ) {
      pDVar4 = (DdHashItem *)((long)next->key + ((ulong)uVar1 - 0x18));
      next->next = pDVar4;
      next = pDVar4;
    }
    next->next = (DdHashItem *)0x0;
  }
  pDVar4 = hash->nextFree;
  hash->nextFree = pDVar4->next;
  return pDVar4;
}

Assistant:

DD_INLINE
static DdHashItem *
cuddHashTableAlloc(
  DdHashTable * hash)
{
    int i;
    unsigned int itemsize = hash->itemsize;
    extern DD_OOMFP MMoutOfMemory;
    DD_OOMFP saveHandler;
#ifdef __osf__
#pragma pointer_size save
#pragma pointer_size short
#endif
    DdHashItem **mem, *thisOne, *next, *item;

    if (hash->nextFree == NULL) {
        saveHandler = MMoutOfMemory;
        MMoutOfMemory = Cudd_OutOfMem;
        mem = (DdHashItem **) ABC_ALLOC(char,(DD_MEM_CHUNK+1) * itemsize);
        MMoutOfMemory = saveHandler;
#ifdef __osf__
#pragma pointer_size restore
#endif
        if (mem == NULL) {
            if (hash->manager->stash != NULL) {
                ABC_FREE(hash->manager->stash);
                hash->manager->stash = NULL;
                /* Inhibit resizing of tables. */
                hash->manager->maxCacheHard = hash->manager->cacheSlots - 1;
                hash->manager->cacheSlack = - (int) (hash->manager->cacheSlots + 1);
                for (i = 0; i < hash->manager->size; i++) {
                    hash->manager->subtables[i].maxKeys <<= 2;
                }
                hash->manager->gcFrac = 0.2;
                hash->manager->minDead =
                    (unsigned) (0.2 * (double) hash->manager->slots);
#ifdef __osf__
#pragma pointer_size save
#pragma pointer_size short
#endif
                mem = (DdHashItem **) ABC_ALLOC(char,(DD_MEM_CHUNK+1) * itemsize);
#ifdef __osf__
#pragma pointer_size restore
#endif
            }
            if (mem == NULL) {
                (*MMoutOfMemory)((long)((DD_MEM_CHUNK + 1) * itemsize));
                hash->manager->errorCode = CUDD_MEMORY_OUT;
                return(NULL);
            }
        }

        mem[0] = (DdHashItem *) hash->memoryList;
        hash->memoryList = mem;

        thisOne = (DdHashItem *) ((char *) mem + itemsize);
        hash->nextFree = thisOne;
        for (i = 1; i < DD_MEM_CHUNK; i++) {
            next = (DdHashItem *) ((char *) thisOne + itemsize);
            thisOne->next = next;
            thisOne = next;
        }

        thisOne->next = NULL;

    }
    item = hash->nextFree;
    hash->nextFree = item->next;
    return(item);

}